

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManifestTest.cpp
# Opt level: O2

void __thiscall
ManifestTest_normalize_path_Test::~ManifestTest_normalize_path_Test
          (ManifestTest_normalize_path_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ManifestTest, normalize_path) {
  EXPECT_EQ(normalize("/", ""), "/");
  EXPECT_EQ(normalize("/", "k"), "/k");
  EXPECT_EQ(normalize("/", ".k"), "/.k");
  EXPECT_EQ(normalize("/", "..k"), "/..k");
  EXPECT_EQ(normalize("/", "."), "/");
  EXPECT_EQ(normalize("/", ".."), "/");
  EXPECT_EQ(normalize("/", "/"), "/");

  EXPECT_EQ(normalize("//", ""), "/");
  EXPECT_EQ(normalize("//", "k"), "/k");
  EXPECT_EQ(normalize("//", ".k"), "/.k");
  EXPECT_EQ(normalize("//", "..k"), "/..k");
  EXPECT_EQ(normalize("//", "."), "/");
  EXPECT_EQ(normalize("//", ".."), "/");
  EXPECT_EQ(normalize("//", "/"), "/");

  EXPECT_EQ(normalize("/", "//"), "/");
  EXPECT_EQ(normalize("/", "k//"), "/k/");
  EXPECT_EQ(normalize("/", ".k//"), "/.k/");
  EXPECT_EQ(normalize("/", "..k//"), "/..k/");
  EXPECT_EQ(normalize("/", ".//"), "/");
  EXPECT_EQ(normalize("/", "..//"), "/");

  EXPECT_EQ(normalize("/", ""), "/");
  EXPECT_EQ(normalize("/", "k"), "/k");
  EXPECT_EQ(normalize("/", ".k"), "/.k");
  EXPECT_EQ(normalize("/", "..k"), "/..k");
  EXPECT_EQ(normalize("/", "."), "/");
  EXPECT_EQ(normalize("/", ".."), "/");
  EXPECT_EQ(normalize("/", "/"), "/");

  EXPECT_EQ(normalize("/a", ""), "/a/");
  EXPECT_EQ(normalize("/a", "k"), "/a/k");
  EXPECT_EQ(normalize("/a", ".k"), "/a/.k");
  EXPECT_EQ(normalize("/a", "..k"), "/a/..k");
  EXPECT_EQ(normalize("/a", "."), "/a/");
  EXPECT_EQ(normalize("/a", ".."), "/");
  EXPECT_EQ(normalize("/a", "/"), "/");

  EXPECT_EQ(normalize("/a", "k/./b"), "/a/k/b");
  EXPECT_EQ(normalize("/a", ".k/./b"), "/a/.k/b");
  EXPECT_EQ(normalize("/a", "..k/./b"), "/a/..k/b");
  EXPECT_EQ(normalize("/a", "././b"), "/a/b");
  EXPECT_EQ(normalize("/a", ".././b"), "/b");
  EXPECT_EQ(normalize("/a", "/./b"), "/b");

  EXPECT_EQ(normalize("/a", "k/../b"), "/a/b");
  EXPECT_EQ(normalize("/a", ".k/../b"), "/a/b");
  EXPECT_EQ(normalize("/a", "..k/../b"), "/a/b");
  EXPECT_EQ(normalize("/a", "./../b"), "/b");
  EXPECT_EQ(normalize("/a", "../../b"), "/b");
  EXPECT_EQ(normalize("/a", "/../b"), "/b");
}